

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snedecor_f_dist.hpp
# Opt level: O1

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  param_type pVar3;
  int m;
  int n;
  delim_c local_23;
  delim_c local_22;
  delim_c local_21;
  int local_20;
  int local_1c;
  
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_21.c = '(';
  pbVar2 = utility::operator>>(in,&local_21);
  pbVar2 = (basic_istream<char,_std::char_traits<char>_> *)
           std::istream::operator>>((istream *)pbVar2,&local_1c);
  local_22.c = ' ';
  pbVar2 = utility::operator>>(pbVar2,&local_22);
  pbVar2 = (basic_istream<char,_std::char_traits<char>_> *)
           std::istream::operator>>((istream *)pbVar2,&local_20);
  local_23.c = ')';
  utility::operator>>(pbVar2,&local_23);
  if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
    pVar3.m_ = local_20;
    pVar3.n_ = local_1c;
    *P = pVar3;
  }
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        int n, m;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> n >> utility::delim(' ') >> m >> utility::delim(')');
        if (in)
          P = snedecor_f_dist::param_type(n, m);
        in.flags(flags);
        return in;
      }